

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O3

void decode_block_void(AV1_COMMON *cm,DecoderCodingBlock *dcb,aom_reader *r,int plane,int row,
                      int col,TX_SIZE tx_size)

{
  return;
}

Assistant:

static inline void decode_block_void(const AV1_COMMON *const cm,
                                     DecoderCodingBlock *dcb,
                                     aom_reader *const r, const int plane,
                                     const int row, const int col,
                                     const TX_SIZE tx_size) {
  (void)cm;
  (void)dcb;
  (void)r;
  (void)plane;
  (void)row;
  (void)col;
  (void)tx_size;
}